

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

Block * __thiscall
google::protobuf::Arena::NewBlock
          (Arena *this,void *me,Block *my_last_block,size_t n,size_t start_block_size,
          size_t max_block_size)

{
  LogMessage *other;
  Block *pBVar1;
  ulong uVar2;
  LogFinisher local_61;
  LogMessage local_60;
  
  if ((my_last_block != (Block *)0x0) &&
     (start_block_size = my_last_block->size * 2, max_block_size <= start_block_size)) {
    start_block_size = max_block_size;
  }
  if (0xffffffffffffffdf < n) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arena.cc"
               ,0x85);
    other = internal::LogMessage::operator<<
                      (&local_60,
                       "CHECK failed: (n) <= (std::numeric_limits<size_t>::max() - kHeaderSize): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  uVar2 = n + 0x20;
  if (start_block_size <= uVar2) {
    start_block_size = uVar2;
  }
  pBVar1 = (Block *)(**(code **)(this + 0x60))(start_block_size);
  pBVar1->pos = uVar2;
  pBVar1->size = start_block_size;
  pBVar1->owner = me;
  return pBVar1;
}

Assistant:

Arena::Block* Arena::NewBlock(void* me, Block* my_last_block, size_t n,
                              size_t start_block_size, size_t max_block_size) {
  size_t size;
  if (my_last_block != NULL) {
    // Double the current block size, up to a limit.
    size = 2 * (my_last_block->size);
    if (size > max_block_size) size = max_block_size;
  } else {
    size = start_block_size;
  }
  // Verify that n + kHeaderSize won't overflow.
  GOOGLE_CHECK_LE(n, std::numeric_limits<size_t>::max() - kHeaderSize);
  size = std::max(size, kHeaderSize + n);

  Block* b = reinterpret_cast<Block*>(options_.block_alloc(size));
  b->pos = kHeaderSize + n;
  b->size = size;
  b->owner = me;
#ifdef ADDRESS_SANITIZER
  // Poison the rest of the block for ASAN. It was unpoisoned by the underlying
  // malloc but it's not yet usable until we return it as part of an allocation.
  ASAN_POISON_MEMORY_REGION(
      reinterpret_cast<char*>(b) + b->pos, b->size - b->pos);
#endif  // ADDRESS_SANITIZER
  return b;
}